

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::QUICMethodTest::ProvideHandshakeData(SSL *ssl,size_t num)

{
  bool bVar1;
  ssl_encryption_level_t level;
  int iVar2;
  MockQUICTransport *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  this = TransportFromSSL(ssl);
  level = SSL_quic_read_level(ssl);
  local_38._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = MockQUICTransport::ReadHandshakeData
                    (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,level,
                     num);
  if (bVar1) {
    iVar2 = SSL_provide_quic_data
                      (ssl,level,local_38._M_impl.super__Vector_impl_data._M_start,
                       (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38._M_impl.super__Vector_impl_data._M_start);
    bVar1 = iVar2 != 0;
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

static bool ProvideHandshakeData(
      SSL *ssl, size_t num = std::numeric_limits<size_t>::max()) {
    MockQUICTransport *transport = TransportFromSSL(ssl);
    ssl_encryption_level_t level = SSL_quic_read_level(ssl);
    std::vector<uint8_t> data;
    return transport->ReadHandshakeData(&data, level, num) &&
           SSL_provide_quic_data(ssl, level, data.data(), data.size());
  }